

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_32U>::contains
          (SmallDenseSet<TypePair,_TypePairHasher,_32U> *this,TypePair *key)

{
  TypePair *pTVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TypePair local_48;
  TypePair *local_38;
  TypePair *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  TypePair *key_local;
  SmallDenseSet<TypePair,_TypePairHasher,_32U> *this_local;
  
  local_24 = this->bucketCount - 1;
  _bucket = key;
  key_local = (TypePair *)this;
  uVar3 = TypePairHasher::operator()((TypePairHasher *)((long)&item + 7),key);
  i = uVar3 & local_24;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      return false;
    }
    pTVar1 = this->data;
    uVar4 = (ulong)i;
    local_38 = pTVar1 + uVar4;
    TypePair::TypePair(&local_48);
    bVar2 = TypePair::operator==(pTVar1 + uVar4,&local_48);
    if (bVar2) break;
    bVar2 = TypePair::operator==(local_38,_bucket);
    if (bVar2) {
      return true;
    }
    i = i + (uint)item + 1 & local_24;
    item._0_4_ = (uint)item + 1;
  }
  return false;
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}